

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_select(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long local_28;
  lua_Integer i;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  iVar2 = lua_type(L,1);
  if ((iVar2 == 4) && (pcVar3 = lua_tolstring(L,1,(size_t *)0x0), *pcVar3 == '#')) {
    lua_pushinteger(L,(long)(iVar1 + -1));
    L_local._4_4_ = 1;
  }
  else {
    local_28 = luaL_checkinteger(L,1);
    if (local_28 < 0) {
      local_28 = iVar1 + local_28;
    }
    else if (iVar1 < local_28) {
      local_28 = (long)iVar1;
    }
    if (local_28 < 1) {
      luaL_argerror(L,1,"index out of range");
    }
    L_local._4_4_ = iVar1 - (int)local_28;
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_select(lua_State *L) {
    int n = lua_gettop(L);
    if (lua_type(L, 1) == LUA_TSTRING && *lua_tostring(L, 1) == '#') {
        lua_pushinteger(L, n - 1);
        return 1;
    } else {
        lua_Integer i = luaL_checkinteger(L, 1);
        if (i < 0) i = n + i;
        else if (i > n) i = n;
        luaL_argcheck(L, 1 <= i, 1, "index out of range");
        return n - (int) i;
    }
}